

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly1305.c
# Opt level: O2

void poly1305_block(cf_poly1305 *ctx,uint32_t *c)

{
  uint uVar1;
  uint32_t *puVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  uint local_58 [20];
  
  poly1305_add(ctx->h,c);
  puVar2 = ctx->r;
  lVar3 = 1;
  for (lVar4 = 0; lVar4 != 0x11; lVar4 = lVar4 + 1) {
    uVar5 = 0;
    puVar8 = puVar2;
    for (lVar6 = 0; lVar7 = lVar4, puVar9 = ctx->r + 0x10, lVar3 != lVar6; lVar6 = lVar6 + 1) {
      uVar5 = uVar5 + *puVar8 * ctx->h[lVar6];
      puVar8 = puVar8 + -1;
    }
    for (; lVar7 != 0x10; lVar7 = lVar7 + 1) {
      uVar5 = uVar5 + ctx->h[lVar7 + 1] * *puVar9 * 0x140;
      puVar9 = puVar9 + -1;
    }
    local_58[lVar4] = uVar5;
    lVar3 = lVar3 + 1;
    puVar2 = puVar2 + 1;
  }
  uVar5 = 0;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    uVar1 = local_58[lVar3];
    local_58[lVar3] = uVar5 + uVar1 & 0xff;
    uVar5 = uVar5 + uVar1 >> 8;
  }
  uVar5 = uVar5 + local_58[0x10];
  local_58[0x10] = uVar5 & 3;
  uVar5 = (uVar5 >> 2) * 5;
  for (lVar3 = 0; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    uVar1 = local_58[lVar3];
    local_58[lVar3] = uVar5 + uVar1 & 0xff;
    uVar5 = uVar5 + uVar1 >> 8;
  }
  local_58[0x10] = local_58[0x10] + uVar5;
  for (lVar3 = 0; lVar3 != 0x11; lVar3 = lVar3 + 1) {
    ctx->h[lVar3] = local_58[lVar3];
  }
  return;
}

Assistant:

static void poly1305_block(cf_poly1305 *ctx,
                           const uint32_t c[17])
{
  poly1305_add(ctx->h, c);
  poly1305_mul(ctx->h, ctx->r);
}